

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall
MPLSParser::composePlayItem
          (MPLSParser *this,BitStreamWriter *writer,size_t playItemNum,
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          *pmtIndexList)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  pointer pmVar7;
  bool bVar8;
  uint16_t uVar9;
  uint value;
  int local_74;
  char clip_codec_identifier [5];
  string clip_Information_file_name;
  
  puVar5 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x10,0);
  iVar2 = *(int *)&(writer->super_BitStream).m_buffer;
  iVar3 = *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar4 = writer->m_bitWrited;
  local_74 = ((int)playItemNum << (this->isDependStreamExist & 0x1fU)) + this->m_m2tsOffset;
  int32ToStr_abi_cxx11_((string *)clip_codec_identifier,&local_74);
  strPadLeft(&clip_Information_file_name,(string *)clip_codec_identifier,5,'0');
  std::__cxx11::string::~string((string *)clip_codec_identifier);
  CLPIStreamInfo::writeString(clip_Information_file_name._M_dataplus._M_p,writer,5);
  builtin_strncpy(clip_codec_identifier,"M2TS",5);
  CLPIStreamInfo::writeString(clip_codec_identifier,writer,4);
  BitStreamWriter::putBits(writer,0xb,0);
  BitStreamWriter::putBit(writer,0);
  BitStreamWriter::putBits(writer,4,(uint)(playItemNum != 0) * 5 + 1);
  BitStreamWriter::putBits(writer,8,(uint)this->ref_to_STC_id);
  if (playItemNum != 0) {
    pmVar7 = (pmtIndexList->
             super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*(size_t *)((long)&pmVar7[playItemNum - 1]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0)
    {
      BitStreamWriter::putBits
                (writer,0x20,
                 (*(_Base_ptr *)
                   ((long)&pmVar7[playItemNum]._M_t._M_impl.super__Rb_tree_header + 0x10))[1].
                 _M_color >> 1);
      goto LAB_001e8a78;
    }
  }
  BitStreamWriter::putBits(writer,0x20,this->IN_time);
LAB_001e8a78:
  pmVar7 = (pmtIndexList->
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((((long)(pmtIndexList->
              super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar7) / 0x30 - 1U == playItemNum
      ) || (*(size_t *)((long)&pmVar7[playItemNum + 1]._M_t._M_impl.super__Rb_tree_header + 0x20) ==
            0)) {
    BitStreamWriter::putBits(writer,0x20,this->OUT_time);
  }
  else {
    BitStreamWriter::putBits
              (writer,0x20,
               (uint)(*(ulong *)(*(_Base_ptr *)
                                  ((long)&pmVar7[playItemNum + 1]._M_t._M_impl.super__Rb_tree_header
                                  + 0x10) + 1) >> 1));
  }
  BitStreamWriter::putBits(writer,0x1c,0);
  bVar8 = isV3();
  value = 0xf;
  if (!bVar8) {
    value = 0;
  }
  BitStreamWriter::putBits(writer,4,value);
  BitStreamWriter::putBit(writer,0);
  bVar8 = isV3();
  BitStreamWriter::putBit(writer,(uint)bVar8);
  BitStreamWriter::putBits(writer,0x1e,0);
  BitStreamWriter::putBit(writer,(uint)this->PlayItem_random_access_flag);
  BitStreamWriter::putBits(writer,7,0);
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,0x10,0);
  composeSTN_table(this,writer,playItemNum,false);
  uVar9 = my_ntohs((short)((int)((*(int *)&(writer->super_BitStream).m_buffer -
                                 *(int *)&(writer->super_BitStream).m_initBuffer) * 8 +
                                writer->m_bitWrited) / 8) +
                   (short)((int)((iVar2 - iVar3) * 8 + uVar4) / -8));
  *(uint16_t *)((long)puVar6 + (long)((int)(uVar1 + ((int)puVar5 - (int)puVar6) * 8) / 8)) = uVar9;
  std::__cxx11::string::~string((string *)&clip_Information_file_name);
  return;
}

Assistant:

void MPLSParser::composePlayItem(BitStreamWriter& writer, const size_t playItemNum,
                                 const std::vector<PMTIndex>& pmtIndexList)
{
    const auto lengthPos = reinterpret_cast<uint16_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(16, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    int fileNum = static_cast<int>(playItemNum);
    if (isDependStreamExist)
        fileNum *= 2;
    const std::string clip_Information_file_name = strPadLeft(int32ToStr(fileNum + m_m2tsOffset), 5u, '0');
    CLPIStreamInfo::writeString(clip_Information_file_name.c_str(), writer, 5);
    constexpr char clip_codec_identifier[] = "M2TS";
    CLPIStreamInfo::writeString(clip_codec_identifier, writer, 4);
    writer.putBits(11, 0);  // reserved_for_future_use
    writer.putBit(0);       // is_multi_angle
    const int connection_condition = playItemNum == 0 ? 1 : 6;
    writer.putBits(4, connection_condition);
    writer.putBits(8, ref_to_STC_id);

    if (playItemNum != 0 && !pmtIndexList[playItemNum - 1].empty())
        writer.putBits(32, static_cast<unsigned>(pmtIndexList[playItemNum].begin()->first) / 2);
    else
        writer.putBits(32, IN_time);

    if (playItemNum != pmtIndexList.size() - 1 && !pmtIndexList[playItemNum + 1].empty())
        writer.putBits(32, static_cast<unsigned>(pmtIndexList[playItemNum + 1].begin()->first / 2));
    else
        writer.putBits(32, OUT_time);

    writer.putBits(28, 0);               // UO_mask_table;
    writer.putBits(4, isV3() ? 15 : 0);  // UO_mask_table;
    writer.putBit(0);                    // reserved
    writer.putBit(isV3() ? 1 : 0);       // UO_mask_table: SecondaryPGStreamNumberChange
    writer.putBits(30, 0);               // UO_mask_table cont;

    writer.putBit(PlayItem_random_access_flag);
    writer.putBits(7, 0);   // reserved_for_future_use
    writer.putBits(8, 0);   // still_mode
    writer.putBits(16, 0);  // reserved after stillMode != 0x01
    composeSTN_table(writer, playItemNum, false);
    *lengthPos = my_htons(static_cast<uint16_t>(writer.getBitsCount() / 8 - beforeCount));
}